

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOBase.c
# Opt level: O0

uint32_t FAPOBase_LockForProcess
                   (FAPOBase *fapo,uint32_t InputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pInputLockedParameters,
                   uint32_t OutputLockedParameterCount,
                   FAPOLockForProcessBufferParameters *pOutputLockedParameters)

{
  FAPOLockForProcessBufferParameters *pOutputLockedParameters_local;
  uint32_t OutputLockedParameterCount_local;
  FAPOLockForProcessBufferParameters *pInputLockedParameters_local;
  uint32_t InputLockedParameterCount_local;
  FAPOBase *fapo_local;
  uint32_t local_4;
  
  if ((((InputLockedParameterCount < fapo->m_pRegistrationProperties->MinInputBufferCount) ||
       (fapo->m_pRegistrationProperties->MaxInputBufferCount < InputLockedParameterCount)) ||
      (OutputLockedParameterCount < fapo->m_pRegistrationProperties->MinOutputBufferCount)) ||
     (fapo->m_pRegistrationProperties->MaxOutputBufferCount < OutputLockedParameterCount)) {
    local_4 = 0x80070057;
  }
  else if (((fapo->m_pRegistrationProperties->Flags & 1) == 0) ||
          (pInputLockedParameters->pFormat->nChannels == pOutputLockedParameters->pFormat->nChannels
          )) {
    if (((fapo->m_pRegistrationProperties->Flags & 2) == 0) ||
       (pInputLockedParameters->pFormat->nSamplesPerSec ==
        pOutputLockedParameters->pFormat->nSamplesPerSec)) {
      if (((fapo->m_pRegistrationProperties->Flags & 4) == 0) ||
         (pInputLockedParameters->pFormat->wBitsPerSample ==
          pOutputLockedParameters->pFormat->wBitsPerSample)) {
        if (((fapo->m_pRegistrationProperties->Flags & 8) == 0) ||
           (InputLockedParameterCount == OutputLockedParameterCount)) {
          fapo->m_fIsLocked = '\x01';
          local_4 = 0;
        }
        else {
          local_4 = 0x80070057;
        }
      }
      else {
        local_4 = 0x80070057;
      }
    }
    else {
      local_4 = 0x80070057;
    }
  }
  else {
    local_4 = 0x80070057;
  }
  return local_4;
}

Assistant:

uint32_t FAPOBase_LockForProcess(
	FAPOBase *fapo,
	uint32_t InputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pInputLockedParameters,
	uint32_t OutputLockedParameterCount,
	const FAPOLockForProcessBufferParameters *pOutputLockedParameters
) {
	/* Verify parameter counts... */
	if (	InputLockedParameterCount < fapo->m_pRegistrationProperties->MinInputBufferCount ||
		InputLockedParameterCount > fapo->m_pRegistrationProperties->MaxInputBufferCount ||
		OutputLockedParameterCount < fapo->m_pRegistrationProperties->MinOutputBufferCount ||
		OutputLockedParameterCount > fapo->m_pRegistrationProperties->MaxOutputBufferCount	)
	{
		return FAUDIO_E_INVALID_ARG;
	}


	/* Validate input/output formats */
	#define VERIFY_FORMAT_FLAG(flag, prop) \
		if (	(fapo->m_pRegistrationProperties->Flags & flag) && \
			(pInputLockedParameters->pFormat->prop != pOutputLockedParameters->pFormat->prop)	) \
		{ \
			return FAUDIO_E_INVALID_ARG; \
		}
	VERIFY_FORMAT_FLAG(FAPO_FLAG_CHANNELS_MUST_MATCH, nChannels)
	VERIFY_FORMAT_FLAG(FAPO_FLAG_FRAMERATE_MUST_MATCH, nSamplesPerSec)
	VERIFY_FORMAT_FLAG(FAPO_FLAG_BITSPERSAMPLE_MUST_MATCH, wBitsPerSample)
	#undef VERIFY_FORMAT_FLAG
	if (	(fapo->m_pRegistrationProperties->Flags & FAPO_FLAG_BUFFERCOUNT_MUST_MATCH) &&
		(InputLockedParameterCount != OutputLockedParameterCount)	)
	{
		return FAUDIO_E_INVALID_ARG;
	}
	fapo->m_fIsLocked = 1;
	return 0;
}